

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile.h
# Opt level: O0

ssize_t hread(hFILE *fp,void *buffer,size_t nbytes)

{
  size_t local_30;
  size_t local_28;
  size_t n;
  size_t nbytes_local;
  void *buffer_local;
  hFILE *fp_local;
  
  local_28 = (long)fp->end - (long)fp->begin;
  if (nbytes < local_28) {
    local_28 = nbytes;
  }
  memcpy(buffer,fp->begin,local_28);
  fp->begin = fp->begin + local_28;
  if (local_28 == nbytes) {
    local_30 = local_28;
  }
  else {
    local_30 = hread2(fp,buffer,nbytes,local_28);
  }
  return local_30;
}

Assistant:

static inline ssize_t HTS_RESULT_USED
hread(hFILE *fp, void *buffer, size_t nbytes)
{
    extern ssize_t hread2(hFILE *, void *, size_t, size_t);

    size_t n = fp->end - fp->begin;
    if (n > nbytes) n = nbytes;
    memcpy(buffer, fp->begin, n);
    fp->begin += n;
    return (n == nbytes)? (ssize_t) n : hread2(fp, buffer, nbytes, n);
}